

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

int english_sentence_length_sample(int *seed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = (*seed % 0x1f31d) * 0x41a7;
  iVar3 = (*seed / 0x1f31d) * -0xb14;
  iVar2 = iVar1 + iVar3;
  iVar1 = iVar1 + iVar3 + 0x7fffffff;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  *seed = iVar1;
  iVar1 = english_sentence_length_cdf_inv((double)iVar1 * 4.656612875e-10);
  return iVar1;
}

Assistant:

int english_sentence_length_sample ( int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    ENGLISH_SENTENCE_LENGTH_SAMPLE samples the English Sentence Length PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    01 August 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Henry Kucera, Winthrop Francis,
//    Computational Analysis of Present-Day American English,
//    Brown University Press, 1967.
//
//  Parameters:
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, int ENGLISH_SENTENCE_LENGTH_SAMPLE, a sample of the PDF.
//
{
  double cdf;
  int x;

  cdf = r8_uniform_01 ( seed );

  x = english_sentence_length_cdf_inv ( cdf );

  return x;
# undef SENTENCE_LENGTH_MAX
}